

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.c
# Opt level: O2

void usage(char *argv0,int exitval,char *errmsg)

{
  FILE *__stream;
  undefined8 *puVar1;
  
  if (exitval == 0) {
    puVar1 = (undefined8 *)&stdout;
  }
  else {
    puVar1 = (undefined8 *)&stderr;
  }
  __stream = (FILE *)*puVar1;
  if (errmsg != (char *)0x0) {
    fprintf(__stream,"ERROR: %s\n\n");
  }
  fprintf(__stream,"Usage: %s [-f|-F <arg>] [-n] [-s]\n",argv0);
  fwrite("  -f - Format the output to stdout with JSON_C_TO_STRING_PRETTY (default is JSON_C_TO_STRING_SPACED)\n"
         ,0x65,1,__stream);
  fwrite("  -F - Format the output to stdout with <arg>, e.g. 0 for JSON_C_TO_STRING_PLAIN\n",0x51,1
         ,__stream);
  fwrite("  -n - No output\n",0x11,1,__stream);
  fwrite("  -c - color\n",0xd,1,__stream);
  fwrite("  -s - Parse in strict mode, flags:\n",0x24,1,__stream);
  fwrite("       JSON_TOKENER_STRICT|JSON_TOKENER_ALLOW_TRAILING_CHARS\n",0x3d,1,__stream);
  fwrite(" Diagnostic information will be emitted to stderr\n",0x32,1,__stream);
  fwrite("\nWARNING WARNING WARNING\n",0x19,1,__stream);
  fwrite("This is a prototype, it may change or be removed at any time!\n",0x3e,1,__stream);
  exit(exitval);
}

Assistant:

static void usage(const char *argv0, int exitval, const char *errmsg)
{
	FILE *fp = stdout;
	if (exitval != 0)
		fp = stderr;
	if (errmsg != NULL)
		fprintf(fp, "ERROR: %s\n\n", errmsg);
	fprintf(fp, "Usage: %s [-f|-F <arg>] [-n] [-s]\n", argv0);
	fprintf(fp, "  -f - Format the output to stdout with JSON_C_TO_STRING_PRETTY (default is JSON_C_TO_STRING_SPACED)\n");
	fprintf(fp, "  -F - Format the output to stdout with <arg>, e.g. 0 for JSON_C_TO_STRING_PLAIN\n");
	fprintf(fp, "  -n - No output\n");
	fprintf(fp, "  -c - color\n");
	fprintf(fp, "  -s - Parse in strict mode, flags:\n");
	fprintf(fp, "       JSON_TOKENER_STRICT|JSON_TOKENER_ALLOW_TRAILING_CHARS\n");
	fprintf(fp, " Diagnostic information will be emitted to stderr\n");

	fprintf(fp, "\nWARNING WARNING WARNING\n");
	fprintf(fp, "This is a prototype, it may change or be removed at any time!\n");
	exit(exitval);
}